

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O3

void __thiscall
flatbuffers::php::PhpGenerator::BeginFile
          (PhpGenerator *this,string *name_space_name,bool needs_imports,string *code_ptr)

{
  pointer pcVar1;
  long *plVar2;
  size_type *psVar3;
  long *plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  std::__cxx11::string::append((char *)code_ptr);
  pcVar1 = (code_ptr->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + code_ptr->_M_string_length);
  std::__cxx11::string::append((char *)local_50);
  BaseGenerator::FlatBuffersGeneratedWarning();
  plVar2 = (long *)std::__cxx11::string::append((char *)local_50);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_90.field_2._M_allocated_capacity = *psVar3;
    local_90.field_2._8_8_ = plVar2[3];
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar3;
    local_90._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_90._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_60 = *plVar4;
    lStack_58 = plVar2[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar4;
    local_70 = (long *)*plVar2;
  }
  local_68 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::operator=((string *)code_ptr,(string *)&local_70);
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (name_space_name->_M_string_length != 0) {
    std::operator+(&local_90,"namespace ",name_space_name);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_60 = *plVar4;
      lStack_58 = plVar2[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar4;
      local_70 = (long *)*plVar2;
    }
    local_68 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_70);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  if (needs_imports) {
    std::__cxx11::string::append((char *)code_ptr);
    std::__cxx11::string::append((char *)code_ptr);
    std::__cxx11::string::append((char *)code_ptr);
    std::__cxx11::string::append((char *)code_ptr);
    std::__cxx11::string::append((char *)code_ptr);
  }
  return;
}

Assistant:

void BeginFile(const std::string &name_space_name, const bool needs_imports,
                 std::string *code_ptr) {
    auto &code = *code_ptr;
    code += "<?php\n";
    code = code + "// " + FlatBuffersGeneratedWarning() + "\n\n";

    if (!name_space_name.empty()) {
      code += "namespace " + name_space_name + ";\n\n";
    }

    if (needs_imports) {
      code += "use \\Google\\FlatBuffers\\Struct;\n";
      code += "use \\Google\\FlatBuffers\\Table;\n";
      code += "use \\Google\\FlatBuffers\\ByteBuffer;\n";
      code += "use \\Google\\FlatBuffers\\FlatBufferBuilder;\n";
      code += "\n";
    }
  }